

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O1

void __thiscall
rigtorp::mpmc::
Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
::~Queue(Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
         *this)

{
  Slot<std::unique_ptr<int,_std::default_delete<int>_>_> *pSVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar3 = this->capacity_;
  if (uVar3 != 0) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      pSVar1 = this->slots_;
      if ((*(ulong *)((long)pSVar1 + lVar4 + -8) & 1) != 0) {
        pvVar2 = *(void **)((long)&(pSVar1->turn).super___atomic_base<unsigned_long>._M_i + lVar4);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,4);
        }
        *(undefined8 *)((long)&(pSVar1->turn).super___atomic_base<unsigned_long>._M_i + lVar4) = 0;
      }
      uVar5 = uVar5 + 1;
      uVar3 = this->capacity_;
      lVar4 = lVar4 + 0x40;
    } while (uVar5 < uVar3);
  }
  operator_delete(this->slots_,uVar3 * 0x40 + 0x40,0x40);
  return;
}

Assistant:

~Queue() noexcept {
    for (size_t i = 0; i < capacity_; ++i) {
      slots_[i].~Slot();
    }
    allocator_.deallocate(slots_, capacity_ + 1);
  }